

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,torrent_peer *p,torrent_state *state)

{
  _Elt_pointer pptVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Elt_pointer pptVar6;
  _Map_pointer ppptVar7;
  _Elt_pointer pptVar8;
  long lVar9;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Elt_pointer local_118;
  iterator local_90;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Elt_pointer local_60;
  _Map_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Map_pointer local_38;
  
  ::std::
  __equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,libtorrent::aux::torrent_peer*,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::peer_address_compare>>
            (&local_70);
  pptVar1 = local_50;
  local_118 = local_68;
  lVar3 = (((ulong)((long)local_38 - (long)local_58) >> 3) - (ulong)(local_38 != (_Map_pointer)0x0))
          * 0x40;
  lVar9 = (long)local_50 - (long)local_48 >> 3;
  lVar4 = ((long)local_60 - (long)local_70 >> 3) + lVar9;
  lVar5 = lVar3 + lVar4 >> 2;
  pptVar6 = local_60;
  ppptVar7 = local_58;
  pptVar8 = local_70;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
    lVar3 = (((ulong)((long)local_38 - (long)ppptVar7) >> 3) -
            (ulong)(local_38 != (_Map_pointer)0x0)) * 0x40;
    lVar4 = ((long)pptVar6 - (long)pptVar8 >> 3) + lVar9;
  }
  lVar4 = lVar4 + lVar3;
  if (lVar4 == 1) {
LAB_002802b2:
    bVar2 = torrent_peer_equal(*pptVar8,p);
    local_90._M_last = pptVar6;
    local_90._M_node = ppptVar7;
    local_90._M_cur = pptVar8;
    if (bVar2) goto LAB_002802dc;
  }
  else {
    if (lVar4 == 2) {
LAB_00280283:
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      goto LAB_002802b2;
    }
    if (lVar4 == 3) {
      bVar2 = torrent_peer_equal(*pptVar8,p);
      local_90._M_last = pptVar6;
      local_90._M_node = ppptVar7;
      local_90._M_cur = pptVar8;
      if (bVar2) goto LAB_002802dc;
      pptVar8 = pptVar8 + 1;
      if (pptVar8 == pptVar6) {
        pptVar8 = ppptVar7[1];
        ppptVar7 = ppptVar7 + 1;
        pptVar6 = pptVar8 + 0x40;
        local_118 = pptVar8;
      }
      goto LAB_00280283;
    }
  }
  local_118 = local_48;
  local_90._M_last = local_40;
  local_90._M_node = local_38;
  local_90._M_cur = pptVar1;
LAB_002802dc:
  if (local_90._M_cur != local_50) {
    local_90._M_first = local_118;
    erase_peer(this,&local_90,state);
  }
  return;
}

Assistant:

void peer_list::erase_peer(torrent_peer* p, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(m_locked_peer != p);

		auto const range = std::equal_range(m_peers.begin(), m_peers.end(), p, peer_address_compare{});
		auto const iter = std::find_if(range.first, range.second, [&](torrent_peer const* needle) {
			return torrent_peer_equal(needle, p);
		});
		if (iter == range.second) return;
		erase_peer(iter, state);
	}